

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam0000000000165570 = 0x2e2e2e2e2e2e2e;
    uRam0000000000165577._0_1_ = '.';
    uRam0000000000165577._1_1_ = '.';
    uRam0000000000165577._2_1_ = '.';
    uRam0000000000165577._3_1_ = '.';
    uRam0000000000165577._4_1_ = '.';
    uRam0000000000165577._5_1_ = '.';
    uRam0000000000165577._6_1_ = '.';
    uRam0000000000165577._7_1_ = '.';
    DAT_00165560 = '.';
    DAT_00165560_1._0_1_ = '.';
    DAT_00165560_1._1_1_ = '.';
    DAT_00165560_1._2_1_ = '.';
    DAT_00165560_1._3_1_ = '.';
    DAT_00165560_1._4_1_ = '.';
    DAT_00165560_1._5_1_ = '.';
    DAT_00165560_1._6_1_ = '.';
    uRam0000000000165568 = 0x2e2e2e2e2e2e2e;
    DAT_0016556f = 0x2e;
    DAT_00165550 = '.';
    DAT_00165550_1._0_1_ = '.';
    DAT_00165550_1._1_1_ = '.';
    DAT_00165550_1._2_1_ = '.';
    DAT_00165550_1._3_1_ = '.';
    DAT_00165550_1._4_1_ = '.';
    DAT_00165550_1._5_1_ = '.';
    DAT_00165550_1._6_1_ = '.';
    uRam0000000000165558._0_1_ = '.';
    uRam0000000000165558._1_1_ = '.';
    uRam0000000000165558._2_1_ = '.';
    uRam0000000000165558._3_1_ = '.';
    uRam0000000000165558._4_1_ = '.';
    uRam0000000000165558._5_1_ = '.';
    uRam0000000000165558._6_1_ = '.';
    uRam0000000000165558._7_1_ = '.';
    DAT_00165540 = '.';
    DAT_00165540_1._0_1_ = '.';
    DAT_00165540_1._1_1_ = '.';
    DAT_00165540_1._2_1_ = '.';
    DAT_00165540_1._3_1_ = '.';
    DAT_00165540_1._4_1_ = '.';
    DAT_00165540_1._5_1_ = '.';
    DAT_00165540_1._6_1_ = '.';
    uRam0000000000165548._0_1_ = '.';
    uRam0000000000165548._1_1_ = '.';
    uRam0000000000165548._2_1_ = '.';
    uRam0000000000165548._3_1_ = '.';
    uRam0000000000165548._4_1_ = '.';
    uRam0000000000165548._5_1_ = '.';
    uRam0000000000165548._6_1_ = '.';
    uRam0000000000165548._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam0000000000165538._0_1_ = '.';
    uRam0000000000165538._1_1_ = '.';
    uRam0000000000165538._2_1_ = '.';
    uRam0000000000165538._3_1_ = '.';
    uRam0000000000165538._4_1_ = '.';
    uRam0000000000165538._5_1_ = '.';
    uRam0000000000165538._6_1_ = '.';
    uRam0000000000165538._7_1_ = '.';
    DAT_0016557f = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void printClosedHeader( std::string const& _name ) {
            printOpenHeader( _name );
            stream << getLineOfChars<'.'>() << "\n";
        }